

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O0

string * __thiscall
WavParserHelper::GetTestFilePath_abi_cxx11_
          (string *__return_storage_ptr__,WavParserHelper *this,TestFileType FileType)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_71;
  undefined1 local_70 [8];
  string FileName;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string BasePath;
  TestFileType FileType_local;
  string *FilePath;
  
  BasePath.field_2._12_4_ = SUB84(this,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"../../Resource/",&local_39)
  ;
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)local_70);
  local_71 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(BasePath.field_2._12_4_) {
  case 0:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-uint8-AFsp.wav");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-Alaw-AFsp.wav");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-mulaw-AFsp.wav");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int12-AFsp.wav");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int16-AFsp.wav");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int24-AFsp.wav");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int32-AFsp.wav");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-float32-AFsp.wav");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-float64-AFsp.wav");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-uint8WE-AFsp.wav");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-AlawWE-AFsp.wav");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-mulawWE-AFsp.wav");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int12WE-AFsp.wav");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int16WE-AFsp.wav");
    break;
  case 0xe:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int24WE-AFsp.wav");
    break;
  case 0xf:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-int32WE-AFsp.wav");
    break;
  case 0x10:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-float32WE-AFsp.wav");
    break;
  case 0x11:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-float64WE-AFsp.wav");
    break;
  case 0x12:
    std::__cxx11::string::operator=((string *)local_70,"6_Channel_ID.wav");
    break;
  case 0x13:
    std::__cxx11::string::operator=((string *)local_70,"8_Channel_ID.wav");
    break;
  case 0x14:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-Bwf-16bit.wav");
    break;
  case 0x15:
    std::__cxx11::string::operator=((string *)local_70,"M1F1-Bwf-RF64-24bit.wav");
    break;
  default:
    std::__cxx11::string::operator=((string *)local_70,"Invalid");
  }
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_71 = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string WavParserHelper::GetTestFilePath(TestFileType FileType)
{
	std::string BasePath = "../../Resource/";
	std::string FileName;
	std::string FilePath;
	switch (FileType)
	{
	case TestFileType::Uint8Stereo:
		FileName = "M1F1-uint8-AFsp.wav";
		break;
	case TestFileType::Uint8ALawStereo:
		FileName = "M1F1-Alaw-AFsp.wav";
		break;
	case TestFileType::UInt8MuLawStereo:
		FileName = "M1F1-mulaw-AFsp.wav";
		break;
	case TestFileType::Int12Stereo:
		FileName = "M1F1-int12-AFsp.wav";
		break;
	case TestFileType::Int16Stereo:
		FileName = "M1F1-int16-AFsp.wav";
		break;
	case TestFileType::Int24Stereo:
		FileName = "M1F1-int24-AFsp.wav";
		break;
	case TestFileType::Int32Stereo:
		FileName = "M1F1-int32-AFsp.wav";
		break;
	case TestFileType::Float32Stereo:
		FileName = "M1F1-float32-AFsp.wav";
		break;
	case TestFileType::Float64Stereo:
		FileName = "M1F1-float64-AFsp.wav";
		break;
	case TestFileType::Uint8StereoExt:
		FileName = "M1F1-uint8WE-AFsp.wav";
		break;
	case TestFileType::UInt8ALawStereoExt:
		FileName = "M1F1-AlawWE-AFsp.wav";
		break;
	case TestFileType::UInt8MuLawStereoExt:
		FileName = "M1F1-mulawWE-AFsp.wav";
		break;
	case TestFileType::Int12StereoExt:
		FileName = "M1F1-int12WE-AFsp.wav";
		break;
	case TestFileType::Int16StereoExt:
		FileName = "M1F1-int16WE-AFsp.wav";
		break;
	case TestFileType::Int24StereoExt:
		FileName = "M1F1-int24WE-AFsp.wav";
		break;
	case TestFileType::Int32StereoExt:
		FileName = "M1F1-int32WE-AFsp.wav";
		break;
	case TestFileType::Float32StereoExt:
		FileName = "M1F1-float32WE-AFsp.wav";
		break;
	case TestFileType::Float64StereoExt:
		FileName = "M1F1-float64WE-AFsp.wav";
		break;
	case TestFileType::Int16Channel_6:
		FileName = "6_Channel_ID.wav";
		break;
	case TestFileType::Int24Channel_8:
		FileName = "8_Channel_ID.wav";
		break;
	case TestFileType::Int16Bwf:
		FileName = "M1F1-Bwf-16bit.wav";
		break;
	case TestFileType::Int24RF64:
		FileName = "M1F1-Bwf-RF64-24bit.wav";
		break;
	default:
		FileName = "Invalid";
	}

	FilePath = BasePath + FileName;

	return FilePath;
}